

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *p,Vec_Int_t *vTrace,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int i;
  int iVar5;
  uint uVar6;
  int i_00;
  int iVar7;
  uint uVar8;
  Wlc_Obj_t *pWVar9;
  Wlc_Obj_t *pWVar10;
  word wVar11;
  word wVar12;
  
  iVar3 = Vec_IntEntryLast(vTrace);
  iVar3 = iVar3 >> 0xb;
  uVar4 = Vec_IntEntryLast(vTrace);
  i = Vec_IntEntry(&p->vCopies,iVar3);
  iVar1 = vMemObjs->nSize;
  iVar5 = Vec_IntEntry(vTrace,0);
  iVar5 = iVar5 >> 0xb;
  uVar6 = Vec_IntEntry(vTrace,0);
  i_00 = Vec_IntEntry(&p->vCopies,iVar5);
  if (vTrace->nSize < 2) {
    __assert_fail("Vec_IntSize(vTrace) >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                  ,0x346,
                  "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                 );
  }
  iVar2 = vMemObjs->nSize;
  iVar7 = Vec_IntEntry(vMemObjs,i);
  if (iVar3 != iVar7) {
    __assert_fail("iObjLast == Vec_IntEntry(vMemObjs, iNumLast)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                  ,0x347,
                  "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                 );
  }
  iVar7 = Vec_IntEntry(vMemObjs,i_00);
  if (iVar5 != iVar7) {
    __assert_fail("iObjFirst == Vec_IntEntry(vMemObjs, iNumFirst)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                  ,0x348,
                  "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                 );
  }
  pWVar9 = Wlc_NtkObj(p,iVar3);
  pWVar10 = Wlc_NtkObj(p,iVar5);
  if ((undefined1  [24])((undefined1  [24])*pWVar9 & (undefined1  [24])0x3f) ==
      (undefined1  [24])0x36) {
    uVar8 = 0;
    if ((*(ushort *)pWVar10 & 0x3f) != 1) {
      if ((*(ushort *)pWVar10 & 0x3f) != 0x37) {
        __assert_fail("Wlc_ObjType(pObjFirst) == WLC_OBJ_WRITE || Wlc_ObjIsPi(pObjFirst)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x34c,
                      "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                     );
      }
      iVar1 = ((uVar4 >> 1 & 0x3ff) * iVar1 + i) * 3;
      iVar3 = ((uVar6 >> 1 & 0x3ff) * iVar2 + i_00) * 3;
      wVar11 = Vec_WrdEntry(vValues,iVar1 + 1);
      wVar12 = Vec_WrdEntry(vValues,iVar3 + 1);
      if (wVar11 != wVar12) {
        __assert_fail("Vec_WrdEntry(vValues, iIndLast + 1) == Vec_WrdEntry(vValues, iIndFirst + 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x34f,
                      "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                     );
      }
      wVar11 = Vec_WrdEntry(vValues,iVar1 + 2);
      wVar12 = Vec_WrdEntry(vValues,iVar3 + 2);
      uVar8 = (uint)(wVar11 != wVar12);
    }
    return uVar8;
  }
  __assert_fail("Wlc_ObjType(pObjLast) == WLC_OBJ_READ",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                ,0x34b,
                "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)");
}

Assistant:

int Wlc_NtkTraceCheckConfict( Wlc_Ntk_t * p, Vec_Int_t * vTrace, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues )
{
    Wlc_Obj_t * pObjLast, * pObjFirst; 
    int iObjLast = Vec_IntEntryLast(vTrace) >> 11;
    int iFrmLast =(Vec_IntEntryLast(vTrace) >> 1) & 0x3FF;
    int iNumLast = Wlc_ObjCopy( p, iObjLast );
    int iIndLast = 3*(iFrmLast*Vec_IntSize(vMemObjs) + iNumLast);
    int iObjFirst = Vec_IntEntry(vTrace, 0) >> 11;
    int iFrmFirst =(Vec_IntEntry(vTrace, 0) >> 1) & 0x3FF;
    int iNumFirst = Wlc_ObjCopy( p, iObjFirst );
    int iIndFirst = 3*(iFrmFirst*Vec_IntSize(vMemObjs) + iNumFirst);
    assert( Vec_IntSize(vTrace) >= 2 );
    assert( iObjLast  == Vec_IntEntry(vMemObjs, iNumLast) );
    assert( iObjFirst == Vec_IntEntry(vMemObjs, iNumFirst) );
    pObjLast  = Wlc_NtkObj(p, iObjLast);
    pObjFirst = Wlc_NtkObj(p, iObjFirst);
    assert( Wlc_ObjType(pObjLast) == WLC_OBJ_READ );
    assert( Wlc_ObjType(pObjFirst) == WLC_OBJ_WRITE || Wlc_ObjIsPi(pObjFirst) );
    if ( Wlc_ObjIsPi(pObjFirst) )
        return 0;
    assert( Vec_WrdEntry(vValues, iIndLast + 1) == Vec_WrdEntry(vValues, iIndFirst + 1) ); // equal addr
    return Vec_WrdEntry(vValues, iIndLast + 2) != Vec_WrdEntry(vValues, iIndFirst + 2); // diff data
}